

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void gl4cts::CopyImage::Utils::packPixel
               (GLenum internal_format,GLenum type,GLdouble red,GLdouble green,GLdouble blue,
               GLdouble alpha,GLubyte *out_pixel)

{
  TestError *this;
  GLuint channel;
  
  if ((int)internal_format < 0x8814) {
    if (0x8228 < (int)internal_format) {
      if (0x13 < internal_format - 0x8229) goto switchD_00879924_caseD_8816;
      if ((0x3f33U >> (internal_format - 0x8229 & 0x1f) & 1) == 0) goto switchD_00879974_caseD_8f95;
switchD_00879974_caseD_8f94:
      channel = 0;
      goto LAB_00879aab;
    }
    if (internal_format - 0x8055 < 7) goto switchD_00879924_caseD_8814;
    if ((5 < internal_format - 0x804f) && (internal_format != 0x2a10))
    goto switchD_00879924_caseD_8816;
  }
  else {
    if (0x8d87 < (int)internal_format) {
      switch(internal_format) {
      case 0x8f94:
      case 0x8f98:
        goto switchD_00879974_caseD_8f94;
      case 0x8f95:
      case 0x8f99:
switchD_00879974_caseD_8f95:
        writeChannel(type,0,red,out_pixel);
        channel = 1;
        red = green;
        break;
      case 0x8f96:
      case 0x8f9a:
        goto switchD_00879924_caseD_8815;
      default:
        switch(internal_format) {
        case 0x8d88:
        case 0x8d8e:
          break;
        case 0x8d89:
        case 0x8d8f:
          goto switchD_00879924_caseD_8815;
        case 0x8d8a:
        case 0x8d8b:
        case 0x8d8c:
        case 0x8d8d:
switchD_00879924_caseD_8816:
          this = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                     ,0x9cf);
          __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        default:
          if (internal_format != 0x906f) goto switchD_00879924_caseD_8816;
        }
      case 0x8f97:
      case 0x8f9b:
switchD_00879924_caseD_8814:
        writeChannel(type,0,red,out_pixel);
        writeChannel(type,1,green,out_pixel);
        writeChannel(type,2,blue,out_pixel);
        channel = 3;
        red = alpha;
      }
      goto LAB_00879aab;
    }
    if ((int)internal_format < 0x8d71) {
      if ((int)internal_format < 0x8c3a) {
        switch(internal_format) {
        case 0x8814:
        case 0x881a:
          goto switchD_00879924_caseD_8814;
        case 0x8815:
        case 0x881b:
          goto switchD_00879924_caseD_8815;
        default:
          goto switchD_00879924_caseD_8816;
        }
      }
      if (internal_format != 0x8c3a) {
        if ((internal_format != 0x8c3d) && (internal_format != 0x8d70))
        goto switchD_00879924_caseD_8816;
        goto switchD_00879924_caseD_8814;
      }
    }
    else if ((int)internal_format < 0x8d7c) {
      if (internal_format != 0x8d71) {
        if (internal_format == 0x8d76) goto switchD_00879924_caseD_8814;
        if (internal_format != 0x8d77) goto switchD_00879924_caseD_8816;
      }
    }
    else if ((int)internal_format < 0x8d82) {
      if (internal_format == 0x8d7c) goto switchD_00879924_caseD_8814;
      if (internal_format != 0x8d7d) goto switchD_00879924_caseD_8816;
    }
    else {
      if (internal_format == 0x8d82) goto switchD_00879924_caseD_8814;
      if (internal_format != 0x8d83) goto switchD_00879924_caseD_8816;
    }
  }
switchD_00879924_caseD_8815:
  writeChannel(type,0,red,out_pixel);
  writeChannel(type,1,green,out_pixel);
  channel = 2;
  red = blue;
LAB_00879aab:
  writeChannel(type,channel,red,out_pixel);
  return;
}

Assistant:

void Utils::packPixel(GLenum internal_format, GLenum type, GLdouble red, GLdouble green, GLdouble blue, GLdouble alpha,
					  GLubyte* out_pixel)
{
	switch (internal_format)
	{
	case GL_R8:
	case GL_R8_SNORM:
	case GL_R16:
	case GL_R16F:
	case GL_R16_SNORM:
	case GL_R32F:
	case GL_R8I:
	case GL_R8UI:
	case GL_R16I:
	case GL_R16UI:
	case GL_R32I:
	case GL_R32UI:
		writeChannel(type, 0, red, out_pixel);
		break;

	case GL_RG8:
	case GL_RG8_SNORM:
	case GL_RG16:
	case GL_RG16F:
	case GL_RG16_SNORM:
	case GL_RG32F:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG32I:
	case GL_RG32UI:
		writeChannel(type, 0, red, out_pixel);
		writeChannel(type, 1, green, out_pixel);
		break;

	case GL_R3_G3_B2:
	case GL_RGB4:
	case GL_RGB5:
	case GL_RGB8:
	case GL_RGB8_SNORM:
	case GL_RGB10:
	case GL_R11F_G11F_B10F:
	case GL_RGB12:
	case GL_RGB16:
	case GL_RGB16F:
	case GL_RGB16_SNORM:
	case GL_RGB32F:
	case GL_RGB8I:
	case GL_RGB8UI:
	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB32I:
	case GL_RGB32UI:
		writeChannel(type, 0, red, out_pixel);
		writeChannel(type, 1, green, out_pixel);
		writeChannel(type, 2, blue, out_pixel);
		break;

	case GL_RGB9_E5:
	case GL_RGBA2:
	case GL_RGBA4:
	case GL_RGB5_A1:
	case GL_RGBA8:
	case GL_RGBA8_SNORM:
	case GL_RGB10_A2:
	case GL_RGBA12:
	case GL_RGBA16:
	case GL_RGBA16F:
	case GL_RGBA16_SNORM:
	case GL_RGBA32F:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGB10_A2UI:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA32I:
	case GL_RGBA32UI:
		writeChannel(type, 0, red, out_pixel);
		writeChannel(type, 1, green, out_pixel);
		writeChannel(type, 2, blue, out_pixel);
		writeChannel(type, 3, alpha, out_pixel);
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}
}